

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::deleteBuffer(ReferenceContext *this,DataBuffer *buffer)

{
  deUint32 target;
  pointer pVVar1;
  DataBuffer *pDVar2;
  size_t vertexAttribNdx;
  ulong uVar3;
  ObjectManager<sglr::rc::DataBuffer> *this_00;
  long lVar4;
  pointer ppVVar5;
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> vertexArrays;
  VertexArray *local_38;
  
  for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
    target = *(deUint32 *)((long)deleteBuffer::bindingPoints + lVar4);
    pDVar2 = getBufferBinding(this,target);
    if (pDVar2 == buffer) {
      setBufferBinding(this,target,(DataBuffer *)0x0);
    }
  }
  vertexArrays.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexArrays.super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::VertexArray>::getAll(&this->m_vertexArrays,&vertexArrays);
  local_38 = &this->m_clientVertexArray;
  std::vector<sglr::rc::VertexArray*,std::allocator<sglr::rc::VertexArray*>>::
  emplace_back<sglr::rc::VertexArray*>
            ((vector<sglr::rc::VertexArray*,std::allocator<sglr::rc::VertexArray*>> *)&vertexArrays,
             &local_38);
  this_00 = &this->m_buffers;
  for (ppVVar5 = vertexArrays.
                 super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 !=
      vertexArrays.
      super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar5 = ppVVar5 + 1) {
    if ((*ppVVar5)->m_elementArrayBufferBinding == buffer) {
      rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(this_00,buffer);
      (*ppVVar5)->m_elementArrayBufferBinding = (DataBuffer *)0x0;
    }
    lVar4 = 0x20;
    for (uVar3 = 0;
        pVVar1 = ((*ppVVar5)->m_arrays).
                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)(((long)((*ppVVar5)->m_arrays).
                               super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x30);
        uVar3 = uVar3 + 1) {
      if (*(DataBuffer **)(&pVVar1->enabled + lVar4) == buffer) {
        rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(this_00,buffer);
        pVVar1 = ((*ppVVar5)->m_arrays).
                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined1 *)((long)pVVar1 + lVar4 + -8) = 1;
        *(undefined8 *)(&pVVar1->enabled + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x30;
    }
  }
  std::_Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::
  ~_Vector_base(&vertexArrays.
                 super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
               );
  rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(this_00,buffer);
  return;
}

Assistant:

void ReferenceContext::deleteBuffer (DataBuffer* buffer)
{
	static const deUint32 bindingPoints[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_DRAW_INDIRECT_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	for (int bindingNdx = 0; bindingNdx < DE_LENGTH_OF_ARRAY(bindingPoints); bindingNdx++)
	{
		if (getBufferBinding(bindingPoints[bindingNdx]) == buffer)
			setBufferBinding(bindingPoints[bindingNdx], DE_NULL);
	}

	{
		vector<VertexArray*> vertexArrays;
		m_vertexArrays.getAll(vertexArrays);
		vertexArrays.push_back(&m_clientVertexArray);

		for (vector<VertexArray*>::iterator i = vertexArrays.begin(); i != vertexArrays.end(); i++)
		{
			if ((*i)->m_elementArrayBufferBinding == buffer)
			{
				m_buffers.releaseReference(buffer);
				(*i)->m_elementArrayBufferBinding = DE_NULL;
			}

			for (size_t vertexAttribNdx = 0; vertexAttribNdx < (*i)->m_arrays.size(); ++vertexAttribNdx)
			{
				if ((*i)->m_arrays[vertexAttribNdx].bufferBinding == buffer)
				{
					m_buffers.releaseReference(buffer);
					(*i)->m_arrays[vertexAttribNdx].bufferDeleted = true;
					(*i)->m_arrays[vertexAttribNdx].bufferBinding = DE_NULL;
				}
			}
		}
	}

	DE_ASSERT(buffer->getRefCount() == 1);
	m_buffers.releaseReference(buffer);
}